

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O2

int h262_block(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,int32_t *block,int intra,
              int chroma)

{
  vs_vlc_val *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  vs_vlc_val *pvVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  char *__ptr;
  int *piVar12;
  size_t sStack_60;
  uint32_t dcd;
  uint32_t tmp;
  uint32_t eb2;
  uint32_t eb1;
  uint32_t sign;
  uint32_t el;
  h262_picparm *local_40;
  h262_seqparm *local_38;
  
  iVar7 = 0;
  local_38 = seqparm;
  if (intra != 0) {
    if (str->dir == VS_ENCODE) {
      dcd = *block;
      uVar5 = -dcd;
      if (0 < (int)dcd) {
        uVar5 = dcd;
      }
      tmp = 0xffffffff;
      do {
        tmp = tmp + 1;
        iVar7 = 1 << ((byte)tmp & 0x1f);
      } while (iVar7 <= (int)uVar5);
      if ((int)dcd < 0) {
        dcd = (dcd + iVar7) - 1;
      }
    }
    pvVar6 = dcs_chroma_vlc;
    if (chroma == 0) {
      pvVar6 = dcs_luma_vlc;
    }
    local_40 = picparm;
    iVar7 = vs_vlc(str,&tmp,pvVar6);
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = vs_u(str,&dcd,tmp);
    if (iVar7 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      if (tmp == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = dcd;
        if (dcd >> ((byte)tmp - 1 & 0x1f) == 0) {
          uVar5 = dcd + (-1 << ((byte)tmp & 0x1f)) + 1;
        }
      }
      *block = uVar5;
    }
    iVar7 = 1;
    picparm = local_40;
  }
  local_40 = picparm;
  if (picparm->picture_coding_type == 4) {
    return 0;
  }
  do {
    if (((intra == 0) || (pvVar6 = block_intra_vlc, local_40->intra_vlc_format == 0)) &&
       (pvVar6 = block_vlc, iVar7 == 0)) {
      pvVar6 = block_0_vlc;
    }
    if (str->dir == VS_ENCODE) {
      lVar11 = (long)iVar7;
      lVar8 = lVar11 << 0x20;
      uVar4 = 0;
      iVar3 = 0;
      for (; lVar11 < 0x40; lVar11 = lVar11 + 1) {
        if (block[lVar11] != 0) goto LAB_001044ae;
        lVar8 = lVar8 + 0x100000000;
        iVar3 = iVar3 + -1;
        uVar4 = uVar4 + 0x1000;
      }
      dcd = -iVar3;
      if (lVar11 == 0x40) {
        tmp = 0;
        iVar7 = 0x40;
      }
      else {
LAB_001044ae:
        dcd = -iVar3;
        uVar2 = *(uint *)((long)block + (lVar8 >> 0x1e));
        if (uVar2 - 0x800 < 0xfffff001) {
LAB_00104788:
          __ptr = "Coeff too large\n";
          sStack_60 = 0x10;
          goto LAB_00104727;
        }
        el = uVar2 & 0xfff;
        uVar10 = -uVar2;
        if (0 < (int)uVar2) {
          uVar10 = uVar2;
        }
        tmp = uVar4 | uVar10;
        sign = uVar2 >> 0x1f;
        piVar12 = &pvVar6->blen;
        do {
          pvVar1 = (vs_vlc_val *)(piVar12 + -1);
          if (*piVar12 == 0) break;
          piVar12 = piVar12 + 0x22;
        } while (pvVar1->val != tmp);
        if ((tmp != (pvVar1->val == 0)) && (tmp = 0xfffff, local_38->is_ext == 0)) {
          if (uVar10 < 0x7f) {
            eb1 = uVar2 & 0xff;
          }
          else {
            if (0xfe < uVar10) goto LAB_00104788;
            eb1 = uVar2 >> 0x18 & 0xffffff80;
            eb2 = uVar2 & 0xff;
          }
        }
        iVar7 = (iVar7 - iVar3) + 1;
      }
    }
    iVar3 = vs_vlc(str,&tmp,pvVar6);
    if (iVar3 != 0) {
      return 1;
    }
    lVar8 = (long)iVar7;
    if (tmp == 0xfffff) {
      iVar3 = vs_u(str,&dcd,6);
      if (iVar3 != 0) {
        return 1;
      }
      if (local_38->is_ext == 0) {
        iVar3 = vs_u(str,&eb1,8);
        if (iVar3 != 0) {
          return 1;
        }
        if (eb1 == 0x80) {
          iVar3 = vs_u(str,&eb2,8);
          if (iVar3 != 0) {
            return 1;
          }
          if (eb2 - 0x81 < 0xffffff80) {
LAB_00104773:
            __ptr = "Invalid escape code\n";
            sStack_60 = 0x14;
LAB_00104727:
            fwrite(__ptr,sStack_60,1,_stderr);
            return 1;
          }
          uVar5 = eb2 | 0xffffff00;
        }
        else if (eb1 == 0) {
          iVar3 = vs_u(str,&eb2,8);
          if (iVar3 != 0) {
            return 1;
          }
          uVar5 = eb2;
          if (eb2 < 0x80) goto LAB_00104773;
        }
        else {
          uVar5 = eb1 | 0xffffff00;
          if ((int)eb1 < 0x81) {
            uVar5 = eb1;
          }
        }
      }
      else {
        iVar3 = vs_u(str,&el,0xc);
        if (iVar3 != 0) {
          return 1;
        }
        uVar5 = el | 0xfffff000;
        if ((el >> 0xb & 1) == 0) {
          uVar5 = el;
        }
        if ((el & 0x7ff) == 0) goto LAB_00104773;
      }
    }
    else {
      if (tmp == 0) {
        if (str->dir != VS_DECODE) {
          return 0;
        }
        if (iVar7 < 0x40) {
          memset(block + lVar8,0,(ulong)(0x3f - iVar7) * 4 + 4);
          return 0;
        }
        return 0;
      }
      iVar3 = vs_u(str,&sign,1);
      if (iVar3 != 0) {
        return 1;
      }
      dcd = tmp >> 0xc;
      uVar5 = -(tmp & 0xfff);
      if (sign == 0) {
        uVar5 = tmp & 0xfff;
      }
    }
    if (str->dir == VS_DECODE) {
      if (0x3f < iVar7) {
LAB_00104714:
        __ptr = "block overflow\n";
        sStack_60 = 0xf;
        goto LAB_00104727;
      }
      lVar11 = lVar8 << 0x20;
      for (lVar9 = 0; uVar4 = (uint)lVar9, dcd != uVar4; lVar9 = lVar9 + 1) {
        if (0x40 - lVar8 == lVar9) {
          dcd = ~uVar4 + dcd;
          goto LAB_00104714;
        }
        block[lVar8 + lVar9] = 0;
        lVar11 = lVar11 + 0x100000000;
      }
      iVar7 = iVar7 + uVar4 + 1;
      *(uint32_t *)((long)block + (lVar11 >> 0x1e)) = uVar5;
    }
  } while( true );
}

Assistant:

int h262_block(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, int32_t *block, int intra, int chroma) {
	int i = 0;
	if (intra) {
		uint32_t dcs;
		uint32_t dcd;
		if (str->dir == VS_ENCODE) {
			dcs = 0;
			while (abs(block[0]) >= (1 << dcs))
				dcs++;
			if (block[0] >= 0) {
				dcd = block[0];
			} else {
				dcd = block[0] + (1 << dcs) - 1;
			}
		}
		if (vs_vlc(str, &dcs, chroma?dcs_chroma_vlc:dcs_luma_vlc)) return 1;
		if (vs_u(str, &dcd, dcs)) return 1;
		if (str->dir == VS_DECODE) {
			if (!dcs) {
				block[0] = 0;
			} else {
				if (dcd >= (1 << (dcs - 1)))
					block[0] = dcd;
				else
					block[0] = dcd - ((1 << dcs) - 1);
			}
		}
		i = 1;
	}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		return 0;
	while (1) {
		uint32_t tmp, run, el, eb1, eb2, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (intra && picparm->intra_vlc_format)
			tab = block_intra_vlc;
		else if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (coeff <= -0x800 || coeff >= 0x800) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				el = coeff & 0xfff;
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				if (tmp == 0xfffff && !seqparm->is_ext) {
					/* make MPEG1 escape codes */
					if (abs(coeff) < 127) {
						eb1 = coeff & 0xff;
					} else if (abs(coeff) < 255) {
						if (coeff < 0)
							eb1 = 0x80;
						else
							eb1 = 0;
						eb2 = coeff & 0xff;
					} else {
						fprintf(stderr, "Coeff too large\n");
						return 1;
					}
				}
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			if (vs_u(str, &run, 6)) return 1;
			if (seqparm->is_ext) {
				/* MPEG2 escape */
				if (vs_u(str, &el, 12)) return 1;
				if (el & 0x800)
					coeff = el | -0x1000;
				else
					coeff = el;
				if (!(el & 0x7ff)) {
					fprintf(stderr, "Invalid escape code\n");
					return 1;
				}
			} else {
				/* MPEG1 escape */
				if (vs_u(str, &eb1, 8)) return 1;
				if (eb1 == 0) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 < 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2;
				} else if (eb1 == 0x80) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 == 0 || eb2 > 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2 | -0x100;
				} else {
					coeff = eb1;
					if (coeff > 0x80)
						coeff |= -0x100;
				}
			}
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}